

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
          (AnimatedPerspectiveCameraNode *this,
          Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *other,AffineSpace3fa *space,
          string *id)

{
  AffineSpace3fa *space_00;
  PerspectiveCameraNode *id_00;
  reference pvVar1;
  string *in_RCX;
  long *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  string *in_stack_fffffffffffffed8;
  PerspectiveCameraNode *in_stack_fffffffffffffee0;
  allocator *paVar2;
  size_type in_stack_fffffffffffffee8;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *in_stack_fffffffffffffef0;
  AffineSpace3fa *other_00;
  PerspectiveCameraNode *this_00;
  allocator local_a9;
  string local_a8 [32];
  AffineSpace3fa *local_88;
  string local_70 [48];
  long *local_40;
  PerspectiveCameraNode *local_30;
  reference local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_40 = in_RSI;
  std::__cxx11::string::string(local_70,in_RCX);
  PerspectiveCameraNode::PerspectiveCameraNode(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_70);
  *in_RDI = &PTR__AnimatedPerspectiveCameraNode_005b2a38;
  local_8 = local_40;
  in_RDI[0x16] = *(undefined8 *)(*local_40 + 0xb0);
  std::
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ::vector((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            *)0x3ac14a);
  local_10 = local_40;
  size((AnimatedPerspectiveCameraNode *)0x3ac184);
  std::
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ::resize(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_88 = (AffineSpace3fa *)0x0;
  while( true ) {
    local_18 = local_40;
    this_00 = (PerspectiveCameraNode *)*local_40;
    other_00 = local_88;
    space_00 = (AffineSpace3fa *)size((AnimatedPerspectiveCameraNode *)0x3ac1df);
    if (space_00 <= other_00) break;
    id_00 = (PerspectiveCameraNode *)PerspectiveCameraNode::operator_new(0x3ac203);
    local_20 = local_40;
    std::
    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                  *)(*local_40 + 0xb8),(size_type)local_88);
    paVar2 = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",paVar2);
    PerspectiveCameraNode::PerspectiveCameraNode
              (this_00,(Ref<embree::SceneGraph::PerspectiveCameraNode> *)other_00,space_00,
               (string *)id_00);
    pvVar1 = std::
             vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                           *)(in_RDI + 0x17),(size_type)local_88);
    local_30 = id_00;
    local_28 = pvVar1;
    if (id_00 != (PerspectiveCameraNode *)0x0) {
      (*(id_00->super_Node).super_RefCount._vptr_RefCount[2])();
    }
    if (pvVar1->ptr != (PerspectiveCameraNode *)0x0) {
      (*(pvVar1->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    pvVar1->ptr = local_30;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    local_88 = (AffineSpace3fa *)((long)&(local_88->l).vx.field_0 + 1);
  }
  return;
}

Assistant:

AnimatedPerspectiveCameraNode (const Ref<AnimatedPerspectiveCameraNode>& other, const AffineSpace3fa& space, const std::string& id)
        : PerspectiveCameraNode(id), time_range(other->time_range)
      {
        cameras.resize(other->size());
        for (size_t i=0; i<other->size(); i++)
          cameras[i] = new PerspectiveCameraNode(other->cameras[i],space);
      }